

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuxPtrs.h
# Opt level: O3

void Js::AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType>::AllocAuxPtrFix
               (FunctionProxy *host,uint8 size)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  Recycler *pRVar5;
  AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *this;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  pRVar5 = host->m_scriptContext->recycler;
  if (pRVar5 == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/AuxPtrs.h"
                                ,0xab,"(recycler != nullptr)","recycler != nullptr");
    if (!bVar2) goto LAB_00779cf4;
    *puVar4 = 0;
  }
  if (size == ' ') {
    local_50 = (undefined1  [8])
               &AuxPtrsFix<Js::FunctionProxy::AuxPointerType,(unsigned_char)32,(unsigned_char)3>::
                typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_2accc7d;
    data.filename._0_4_ = 0xb3;
    pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,(TrackAllocData *)local_50);
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00779cf4;
      *puVar4 = 0;
    }
    this = (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *)
           Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>(pRVar5,0x20)
    ;
    if (this == (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x20d,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) goto LAB_00779cf4;
      *puVar4 = 0;
    }
    AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)'_',_(unsigned_char)'\x03'>::
    AuxPtrsFix((AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)___,_(unsigned_char)__x03_>
                *)this,(AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)__x10_,_(unsigned_char)__x01_>
                        *)(host->auxPtrs).ptr);
  }
  else {
    if (size != '\x10') {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/AuxPtrs.h"
                                  ,0xb7,"(false)","false");
      if (bVar2) {
        *puVar4 = 0;
        return;
      }
LAB_00779cf4:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    local_50 = (undefined1  [8])
               &AuxPtrsFix<Js::FunctionProxy::AuxPointerType,(unsigned_char)16,(unsigned_char)1>::
                typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_2accc7d;
    data.filename._0_4_ = 0xaf;
    pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,(TrackAllocData *)local_50);
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1ef,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00779cf4;
      *puVar4 = 0;
    }
    this = (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *)
           Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>(pRVar5,0x10)
    ;
    if (this == (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1f2,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) goto LAB_00779cf4;
      *puVar4 = 0;
    }
    ((Type *)(this->offsets + 6))->ptr = (void *)0x0;
    this->count = '\x01';
    this->capacity = 0xff;
  }
  Memory::Recycler::WBSetBit((char *)&host->auxPtrs);
  (host->auxPtrs).ptr = this;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&host->auxPtrs);
  return;
}

Assistant:

void AuxPtrs<T, FieldsEnum>::AllocAuxPtrFix(T* host, uint8 size)
    {
        Recycler* recycler = host->GetRecycler();
        Assert(recycler != nullptr);

        if (size == 16)
        {
            host->auxPtrs = (AuxPtrs<T, FieldsEnum>*)RecyclerNewWithBarrierStructZ(recycler, AuxPtrs16);
        }
        else if (size == 32)
        {
            host->auxPtrs = (AuxPtrs<T, FieldsEnum>*)RecyclerNewWithBarrierPlusZ(recycler, 0, AuxPtrs32, (AuxPtrs16*)(void*)host->auxPtrs);
        }
        else
        {
            Assert(false);
        }
    }